

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::cose::CoseTest_CoseSignAndVerify_SignWithExternalData_Test::TestBody
          (CoseTest_CoseSignAndVerify_SignWithExternalData_Test *this)

{
  allocator<unsigned_char> *this_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_490;
  Message local_488;
  ErrorCode local_47c;
  Error local_478;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_10;
  Message local_438;
  ErrorCode local_42c;
  Error local_428;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_9;
  Message local_3e8;
  ErrorCode local_3dc;
  Error local_3d8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_8;
  Message local_398;
  ErrorCode local_38c;
  Error local_388;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_7;
  Message local_348;
  ErrorCode local_33c;
  Error local_338;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_6;
  Message local_2f8;
  ErrorCode local_2ec;
  Error local_2e8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_5;
  Message local_2a8;
  ErrorCode local_29c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_298;
  Error local_280;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_4;
  Message local_240;
  ErrorCode local_234;
  Error local_230;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_3;
  Message local_1f0;
  ErrorCode local_1e4;
  Error local_1e0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  Sign1Message msg;
  ByteArray signature;
  Message local_178;
  ErrorCode local_170;
  allocator<unsigned_char> local_169;
  ByteArray local_168;
  Error local_150;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  ErrorCode local_108;
  allocator<unsigned_char> local_101;
  ByteArray local_100;
  Error local_e8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  mbedtls_pk_context privateKey;
  mbedtls_pk_context publicKey;
  undefined1 local_68 [8];
  ByteArray externalData;
  allocator<unsigned_char> local_3f;
  uchar local_3e [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  ByteArray content;
  CoseTest_CoseSignAndVerify_SignWithExternalData_Test *this_local;
  
  builtin_memcpy(local_3e,"\x01\x02\x03\x04\x05\x06",6);
  local_38 = local_3e;
  local_30 = 6;
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_3f);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l_00,&local_3f);
  std::allocator<unsigned_char>::~allocator(&local_3f);
  publicKey.private_priv_id._2_1_ = 6;
  publicKey.private_priv_id._3_1_ = 5;
  publicKey._20_1_ = 4;
  publicKey._21_1_ = 3;
  publicKey._22_1_ = 2;
  publicKey._23_1_ = 1;
  this_00 = (allocator<unsigned_char> *)((long)&publicKey.private_priv_id + 1);
  std::allocator<unsigned_char>::allocator(this_00);
  __l._M_len = 6;
  __l._M_array = (iterator)((long)&publicKey.private_priv_id + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__l,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&publicKey.private_priv_id + 1));
  mbedtls_pk_init((mbedtls_pk_context_conflict *)&privateKey.private_priv_id);
  mbedtls_pk_init((mbedtls_pk_context_conflict *)&gtest_ar.message_);
  std::allocator<unsigned_char>::allocator(&local_101);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_100,
             "-----BEGIN CERTIFICATE-----\r\nMIICATCCAaegAwIBAgIIJU8KN/Bcw4cwCgYIKoZIzj0EAwIwGDEWMBQGA1UEAwwN\r\nVGhyZWFkR3JvdXBDQTAeFw0xOTA2MTkyMTM2MTFaFw0yNDA2MTcyMTM2MTFaMBox\r\nGDAWBgNVBAMMD1RocmVhZFJlZ2lzdHJhcjBZMBMGByqGSM49AgEGCCqGSM49AwEH\r\nA0IABCAwhVvoRpELPssVyvhXLT61Zb3GVKFe+vbt66qLnhYIxckQyTogho/IUE03\r\nDxsm+pdZ9nmDu3iGPtqay+pRJPajgdgwgdUwDwYDVR0TBAgwBgEB/wIBAjALBgNV\r\nHQ8EBAMCBeAwbAYDVR0RBGUwY6RhMF8xCzAJBgNVBAYTAlVTMRUwEwYDVQQKDAxU\r\naHJlYWQgR3JvdXAxFzAVBgNVBAMMDlRlc3QgUmVnaXN0cmFyMSAwHgYJKoZIhvcN\r\nAQkBFhFtYXJ0aW5Ac3Rva29lLm5ldDBHBgNVHSMEQDA+gBSS6nZAQEqPq08nC/O8\r\nN52GzXKA+KEcpBowGDEWMBQGA1UEAwwNVGhyZWFkR3JvdXBDQYIIc5C+m8ijatIw\r\nCgYIKoZIzj0EAwIDSAAwRQIgbI7Vrg348jGCENRtT3GbV5FaEqeBaVTeHlkCA99z\r\nRVACIQDGDdZSWXAR+AlfmrDecYnmp5Vgz8eTyjm9ZziIFXPUwA==\r\n-----END CERTIFICATE-----\r\n"
             ,"",&local_101);
  ParsePublicKey(&local_e8,(mbedtls_pk_context *)&privateKey.private_priv_id,&local_100);
  local_108 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_c0,
             "ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)})"
             ,"ErrorCode::kNone",&local_e8,&local_108);
  Error::~Error(&local_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
  std::allocator<unsigned_char>::~allocator(&local_101);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<unsigned_char>::allocator(&local_169);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_168,
             "-----BEGIN PRIVATE KEY-----\r\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgYJ/MP0dWA9BkYd4W\r\ns6oRY62hDddaEmrAVm5dtAXE/UGhRANCAAQgMIVb6EaRCz7LFcr4Vy0+tWW9xlSh\r\nXvr27euqi54WCMXJEMk6IIaPyFBNNw8bJvqXWfZ5g7t4hj7amsvqUST2\r\n-----END PRIVATE KEY-----\r\n"
             ,"",&local_169);
  ParsePrivateKey(&local_150,(mbedtls_pk_context *)&gtest_ar.message_,&local_168);
  local_170 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_128,
             "ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)})"
             ,"ErrorCode::kNone",&local_150,&local_170);
  Error::~Error(&local_150);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_168);
  std::allocator<unsigned_char>::~allocator(&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&msg.mSign);
  Sign1Message::Sign1Message((Sign1Message *)&gtest_ar_2.message_);
  Sign1Message::Init(&local_1e0,(Sign1Message *)&gtest_ar_2.message_,0);
  local_1e4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1b8,"msg.Init(kInitFlagsNone)","ErrorCode::kNone",&local_1e0,
             &local_1e4);
  Error::~Error(&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  Sign1Message::AddAttribute(&local_230,(Sign1Message *)&gtest_ar_2.message_,1,-7,1);
  local_234 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_208,
             "msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly)",
             "ErrorCode::kNone",&local_230,&local_234);
  Error::~Error(&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_298);
  Sign1Message::SetContent(&local_280,(Sign1Message *)&gtest_ar_2.message_,&local_298);
  local_29c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_258,"msg.SetContent({})","ErrorCode::kNone",&local_280,&local_29c);
  Error::~Error(&local_280);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  Sign1Message::SetExternalData
            (&local_2e8,(Sign1Message *)&gtest_ar_2.message_,(ByteArray *)local_68);
  local_2ec = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_2c0,"msg.SetExternalData(externalData)","ErrorCode::kNone",&local_2e8
             ,&local_2ec);
  Error::~Error(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  Sign1Message::Sign(&local_338,(Sign1Message *)&gtest_ar_2.message_,
                     (mbedtls_pk_context_conflict *)&gtest_ar.message_);
  local_33c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_310,"msg.Sign(privateKey)","ErrorCode::kNone",&local_338,&local_33c);
  Error::~Error(&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  Sign1Message::Serialize(&local_388,(Sign1Message *)&gtest_ar_2.message_,(ByteArray *)&msg.mSign);
  local_38c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_360,"msg.Serialize(signature)","ErrorCode::kNone",&local_388,
             &local_38c);
  Error::~Error(&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  Sign1Message::Free((Sign1Message *)&gtest_ar_2.message_);
  Sign1Message::Deserialize(&local_3d8,(Sign1Message *)&gtest_ar_2.message_,(ByteArray *)&msg.mSign)
  ;
  local_3dc = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_3b0,"Sign1Message::Deserialize(msg, signature)","ErrorCode::kNone",
             &local_3d8,&local_3dc);
  Error::~Error(&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  Sign1Message::SetExternalData
            (&local_428,(Sign1Message *)&gtest_ar_2.message_,(ByteArray *)local_68);
  local_42c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_400,"msg.SetExternalData(externalData)","ErrorCode::kNone",&local_428
             ,&local_42c);
  Error::~Error(&local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  Sign1Message::Validate
            (&local_478,(Sign1Message *)&gtest_ar_2.message_,
             (mbedtls_pk_context_conflict *)&privateKey.private_priv_id);
  local_47c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_450,"msg.Validate(publicKey)","ErrorCode::kNone",&local_478,
             &local_47c);
  Error::~Error(&local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  Sign1Message::~Sign1Message((Sign1Message *)&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&msg.mSign);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(CoseTest, CoseSignAndVerify_SignWithExternalData)
{
    ByteArray content{1, 2, 3, 4, 5, 6};
    ByteArray externalData{6, 5, 4, 3, 2, 1};

    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);

    EXPECT_EQ(ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)}),
              ErrorCode::kNone);
    EXPECT_EQ(ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)}), ErrorCode::kNone);

    ByteArray    signature;
    Sign1Message msg;

    EXPECT_EQ(msg.Init(kInitFlagsNone), ErrorCode::kNone);
    EXPECT_EQ(msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly), ErrorCode::kNone);
    EXPECT_EQ(msg.SetContent({}), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Sign(privateKey), ErrorCode::kNone);

    EXPECT_EQ(msg.Serialize(signature), ErrorCode::kNone);
    msg.Free();

    EXPECT_EQ(Sign1Message::Deserialize(msg, signature), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Validate(publicKey), ErrorCode::kNone);
}